

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

Symbol * slang::ast::createCheckerFormal
                   (Compilation *comp,AssertionPortSymbol *port,CheckerInstanceBodySymbol *instance,
                   ExpressionSyntax **outputInitialSyntax,ASTContext *context)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax;
  __optional_eq_t<slang::ast::ArgumentDirection,_slang::ast::ArgumentDirection> _Var1;
  int iVar2;
  SyntaxNode *pSVar3;
  DeclaredType *this;
  __extent_storage<18446744073709551615UL> node;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *__range;
  ExpressionSyntax *pEVar4;
  undefined4 extraout_var;
  undefined8 *in_RCX;
  undefined8 *puVar5;
  long in_RDX;
  void *__child_stack;
  AssertionPortSymbol *in_RSI;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *in_RDI;
  void *in_R8;
  AssertionPortSymbol *cloned;
  SyntaxNode *portSyntax_1;
  FormalArgumentSymbol *arg;
  SyntaxNode *portSyntax;
  SyntaxNode *in_stack_000005b8;
  Scope *in_stack_000005c0;
  ValueSymbol *in_stack_ffffffffffffff58;
  FormalArgumentSymbol *in_stack_ffffffffffffff60;
  string_view *args_2;
  SourceLocation *args_1;
  Scope *in_stack_ffffffffffffff88;
  Symbol *in_stack_ffffffffffffff90;
  pointer in_stack_ffffffffffffff98;
  FormalArgumentSymbol *local_8;
  
  puVar5 = in_RCX;
  pSVar3 = Symbol::getSyntax(&in_RSI->super_Symbol);
  iVar2 = (int)puVar5;
  if ((pSVar3 != (SyntaxNode *)0x0) && (pSVar3->previewNode != (SyntaxNode *)0x0)) {
    Scope::addMembers(in_stack_000005c0,in_stack_000005b8);
  }
  _Var1 = std::operator==((optional<slang::ast::ArgumentDirection> *)in_stack_ffffffffffffff60,
                          (ArgumentDirection *)in_stack_ffffffffffffff58);
  if (_Var1) {
    args_2 = &(in_RSI->super_Symbol).name;
    args_1 = &(in_RSI->super_Symbol).location;
    std::optional<slang::ast::ArgumentDirection>::operator*
              ((optional<slang::ast::ArgumentDirection> *)0x368979);
    local_8 = BumpAllocator::
              emplace<slang::ast::FormalArgumentSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,slang::ast::ArgumentDirection_const&,slang::ast::VariableLifetime>
                        ((BumpAllocator *)in_stack_ffffffffffffff90,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_ffffffffffffff88,args_1,(ArgumentDirection *)args_2,
                         (VariableLifetime *)in_RDI);
    ValueSymbol::getDeclaredType(in_stack_ffffffffffffff58);
    this = not_null<slang::ast::DeclaredType_*>::operator->
                     ((not_null<slang::ast::DeclaredType_*> *)0x3689bb);
    DeclaredType::setLink(this,&in_RSI->declaredType);
    node._M_extent_value = (size_t)Symbol::getSyntax(&in_RSI->super_Symbol);
    if ((SyntaxNode *)node._M_extent_value != (SyntaxNode *)0x0) {
      Symbol::setSyntax((Symbol *)local_8,(SyntaxNode *)node._M_extent_value);
      __range = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(in_RDX + 0x40);
      in_stack_ffffffffffffff60 = local_8;
      slang::syntax::SyntaxNode::as<slang::syntax::AssertionItemPortSyntax>
                ((SyntaxNode *)node._M_extent_value);
      std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
      span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                (in_RDI,__range);
      syntax._M_extent._M_extent_value = node._M_extent_value;
      syntax._M_ptr = in_stack_ffffffffffffff98;
      Symbol::setAttributes(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,syntax);
    }
    if (in_RSI->defaultValueSyntax != (PropertyExprSyntax *)0x0) {
      pEVar4 = ASTContext::requireSimpleExpr
                         ((ASTContext *)in_stack_ffffffffffffff60,
                          (PropertyExprSyntax *)in_stack_ffffffffffffff58);
      *in_RCX = pEVar4;
    }
    Scope::addMember((Scope *)in_stack_ffffffffffffff60,&in_stack_ffffffffffffff58->super_Symbol);
  }
  else {
    iVar2 = AssertionPortSymbol::clone(in_RSI,(__fn *)(in_RDX + 0x40),__child_stack,iVar2,in_R8);
    local_8 = (FormalArgumentSymbol *)CONCAT44(extraout_var,iVar2);
    Scope::addMember((Scope *)in_stack_ffffffffffffff60,&in_stack_ffffffffffffff58->super_Symbol);
  }
  return (Symbol *)local_8;
}

Assistant:

static const Symbol* createCheckerFormal(Compilation& comp, const AssertionPortSymbol& port,
                                         CheckerInstanceBodySymbol& instance,
                                         const ExpressionSyntax*& outputInitialSyntax,
                                         const ASTContext& context) {
    if (auto portSyntax = port.getSyntax(); portSyntax && portSyntax->previewNode)
        instance.addMembers(*portSyntax->previewNode);

    // Output ports are special; they aren't involved in the rewriting process,
    // they just act like normal formal ports / arguments.
    if (port.direction == ArgumentDirection::Out) {
        auto arg = comp.emplace<FormalArgumentSymbol>(port.name, port.location, *port.direction,
                                                      VariableLifetime::Static);
        arg->getDeclaredType()->setLink(port.declaredType);

        if (auto portSyntax = port.getSyntax()) {
            arg->setSyntax(*portSyntax);
            arg->setAttributes(instance, portSyntax->as<AssertionItemPortSyntax>().attributes);
        }

        if (port.defaultValueSyntax)
            outputInitialSyntax = context.requireSimpleExpr(*port.defaultValueSyntax);

        instance.addMember(*arg);
        return arg;
    }
    else {
        // Clone all of the formal arguments and add them to the instance so that
        // members in the body can reference them.
        auto& cloned = port.clone(instance);
        instance.addMember(cloned);
        return &cloned;
    }
}